

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpBase::OnRelocCount
          (BinaryReaderObjdumpBase *this,Index count,Index section_index)

{
  size_type sVar1;
  pointer this_00;
  reference pvVar2;
  Index section_index_local;
  Index count_local;
  BinaryReaderObjdumpBase *this_local;
  
  sVar1 = std::vector<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>::size
                    (&this->section_types_);
  if (section_index < sVar1) {
    pvVar2 = std::vector<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>::operator[]
                       (&this->section_types_,(ulong)section_index);
    this->reloc_section_ = *pvVar2;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    this_00 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::operator->
                        (&this->err_stream_);
    Stream::Writef(&this_00->super_Stream,"invalid relocation section index: %u\n",
                   (ulong)section_index);
    this->reloc_section_ = Invalid;
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpBase::OnRelocCount(Index count, Index section_index) {
  if (section_index >= section_types_.size()) {
    err_stream_->Writef("invalid relocation section index: %" PRIindex "\n",
                        section_index);
    reloc_section_ = BinarySection::Invalid;
    return Result::Error;
  }
  reloc_section_ = section_types_[section_index];
  return Result::Ok;
}